

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O2

void __thiscall Serializer_Normal_Test::~Serializer_Normal_Test(Serializer_Normal_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Serializer, Normal) {
  Serializer builder;
  builder.AddDirectNumber(uint32_t{1});
  builder.AddDirectNumber(uint64_t{2});
  builder.AddDirectByte(3);
  builder.AddVariableInt(0x01ffff);
  builder.AddVariableBuffer(ByteData("f1f2"));
  builder.AddPrefixBuffer(0xe1e2e3e4, ByteData("d1d2d3d4"));
  builder.AddDirectBytes(ByteData("c1c2c3c4"));

  EXPECT_EQ("01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
      builder.Output().GetHex());

  Serializer obj(builder);
  Serializer obj2;
  obj2 = builder;
  EXPECT_EQ(builder.Output().GetHex(), obj.Output().GetHex());
  EXPECT_EQ(builder.Output().GetHex(), obj2.Output().GetHex());
}